

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall
Catch::
MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
::streamReconstructedExpression
          (MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
           *this,ostream *os)

{
  Detail *this_00;
  size_type sVar1;
  undefined1 uVar2;
  ostream *poVar3;
  undefined1 in_R8B;
  StringRef string;
  string local_68;
  string local_48;
  
  this_00 = (Detail *)(this->m_arg->_M_dataplus)._M_p;
  sVar1 = this->m_arg->_M_string_length;
  uVar2 = (**(code **)(*(long *)*Context::currentContext + 0x50))();
  string.m_size._0_1_ = uVar2;
  string.m_start = (char *)sVar1;
  string.m_size._1_7_ = 0;
  Detail::convertIntoString_abi_cxx11_(&local_48,this_00,string,(bool)in_R8B);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_48._M_dataplus._M_p,local_48._M_string_length);
  local_68._M_dataplus._M_p._0_1_ = 0x20;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_68,1);
  Matchers::MatcherUntypedBase::toString_abi_cxx11_
            (&local_68,&this->m_matcher->super_MatcherUntypedBase);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,local_68._M_dataplus._M_p._0_1_
                                    ),local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_68._M_dataplus._M_p._1_7_,local_68._M_dataplus._M_p._0_1_) !=
      &local_68.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_68._M_dataplus._M_p._1_7_,local_68._M_dataplus._M_p._0_1_),
                    local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream& os ) const override {
            os << Catch::Detail::stringify( m_arg )
               << ' '
               << m_matcher.toString();
        }